

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O1

DPSprite * __thiscall player_t::FindPSprite(player_t *this,int layer)

{
  DPSprite *pDVar1;
  DPSprite *pDVar2;
  
  if (layer == 0) {
    return (DPSprite *)0x0;
  }
  pDVar2 = (this->psprites).field_0.p;
  if ((pDVar2 != (DPSprite *)0x0) && (((pDVar2->super_DObject).ObjectFlags & 0x20) != 0)) {
    (this->psprites).field_0.p = (DPSprite *)0x0;
    pDVar2 = (DPSprite *)0x0;
  }
  if (pDVar2 != (DPSprite *)0x0) {
    while (pDVar2->ID != layer) {
      pDVar1 = (pDVar2->Next).field_0.p;
      if ((pDVar1 != (DPSprite *)0x0) && (((pDVar1->super_DObject).ObjectFlags & 0x20) != 0)) {
        (pDVar2->Next).field_0.p = (DPSprite *)0x0;
        pDVar1 = (DPSprite *)0x0;
      }
      pDVar2 = pDVar1;
      if (pDVar1 == (DPSprite *)0x0) {
        return (DPSprite *)0x0;
      }
    }
  }
  return pDVar2;
}

Assistant:

DPSprite *player_t::FindPSprite(int layer)
{
	if (layer == 0)
		return nullptr;

	DPSprite *pspr = psprites;
	while (pspr)
	{
		if (pspr->ID == layer)
			break;

		pspr = pspr->Next;
	}

	return pspr;
}